

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O0

int __thiscall
FZipExploder::DecodeSF
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          int numvals)

{
  uint uVar1;
  int local_43c;
  int bl;
  int nv;
  int v;
  int n;
  int i;
  uchar c;
  uchar a;
  TableBuilder builder [256];
  int numvals_local;
  TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder_local;
  FZipExploder *this_local;
  
  bl = 0;
  n._2_1_ = 0;
  builder[0xff] = (TableBuilder)numvals;
  if (this->InLeft != 0) {
    this->InLeft = this->InLeft - 1;
    if (this->bs < this->be) {
      uVar1 = this->bs;
      this->bs = uVar1 + 1;
      n._2_1_ = this->ReadBuf[uVar1];
    }
    else {
      uVar1 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (this->In,this->ReadBuf,0x100);
      this->be = uVar1;
      n._2_1_ = this->ReadBuf[0];
      this->bs = 1;
    }
  }
  for (v = 0; v < (int)(n._2_1_ + 1); v = v + 1) {
    n._3_1_ = 0;
    if (this->InLeft != 0) {
      this->InLeft = this->InLeft - 1;
      if (this->bs < this->be) {
        uVar1 = this->bs;
        this->bs = uVar1 + 1;
        n._3_1_ = this->ReadBuf[uVar1];
      }
      else {
        uVar1 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (this->In,this->ReadBuf,0x100);
        this->be = uVar1;
        n._3_1_ = this->ReadBuf[0];
        this->bs = 1;
      }
    }
    local_43c = ((int)(uint)n._3_1_ >> 4) + 1;
    while (local_43c != 0) {
      *(byte *)((long)&i + (long)bl * 4 + 1) = (n._3_1_ & 0xf) + 1;
      *(char *)(&i + bl) = (char)bl;
      bl = bl + 1;
      local_43c = local_43c + -1;
    }
  }
  if ((TableBuilder)bl == builder[0xff]) {
    this_local._4_4_ = BuildDecoder(this,decoder,(TableBuilder *)&i,bl);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int FZipExploder::DecodeSF(TArray<HuffNode> &decoder, int numvals)
{
	TableBuilder builder[256];
	unsigned char a, c;
	int i, n, v = 0;

	READBYTE(c);
	n = c + 1;
	for (i = 0; i < n; i++) {
		int nv, bl;
		READBYTE(a);
		nv = ((a >> 4) & 15) + 1;
		bl = (a & 15) + 1;
		while (nv--) {
			builder[v].Length = bl;
			builder[v].Value = v;
			v++;
		}
	}
	if (v != numvals)
		return 1;	/* bad table */
	return BuildDecoder(decoder, builder, v);
}